

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PostScript.cxx
# Opt level: O2

void __thiscall
Fl_PostScript_Graphics_Driver::arc
          (Fl_PostScript_Graphics_Driver *this,int x,int y,int w,int h,double a1,double a2)

{
  if (h < 2 || w < 2) {
    return;
  }
  fwrite("GS\n",3,1,(FILE *)this->output);
  (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x19])(this);
  clocale_printf(this,"%g %g TR\n",(double)x + (double)w * 0.5 + -0.5,
                 (double)y + (double)h * 0.5 + -0.5);
  clocale_printf(this,"%g %g SC\n",(double)(w + -1) * 0.5,(double)(h + -1) * 0.5);
  (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x1f])
            (0,0,0x3ff0000000000000,a2,a1,this);
  clocale_printf(this,"%g %g SC\n",2.0 / (double)(w + -1),2.0 / (double)(h + -1));
  clocale_printf(this,"%g %g TR\n",((double)-x - (double)w * 0.5) + 0.5,
                 ((double)-y - (double)h * 0.5) + 0.5);
  (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x23])(this);
  fwrite("GR\n",3,1,(FILE *)this->output);
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::arc(int x, int y, int w, int h, double a1, double a2) {
  if (w <= 1 || h <= 1) return;
  fprintf(output, "GS\n");
  //fprintf(output, "BP\n");
  begin_line();
  clocale_printf("%g %g TR\n", x + w/2.0 -0.5 , y + h/2.0 - 0.5);
  clocale_printf("%g %g SC\n", (w-1)/2.0 , (h-1)/2.0 );
  arc(0,0,1,a2,a1);
  //  fprintf(output, "0 0 1 %g %g arc\n" , -a1 , -a2);
  clocale_printf("%g %g SC\n", 2.0/(w-1) , 2.0/(h-1) );
  clocale_printf("%g %g TR\n", -x - w/2.0 +0.5 , -y - h/2.0 +0.5);
  end_line();
  
  //  fprintf(output, "%g setlinewidth\n",  2/sqrt(w*h));
  //  fprintf(output, "ELP\n");
  //  fprintf(output, 2.0/w , 2.0/w , " SC\n";
  //  fprintf(output, (-x - w/2.0) , (-y - h/2)  , " TR\n";
  fprintf(output, "GR\n");
}